

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::filename_enumerator(ImgfsFile *this,namefn *fn)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_files)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(fn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (p_Var1 + 1));
  }
  return;
}

Assistant:

virtual void filename_enumerator(namefn fn)
    {
        for (auto i=_files.begin() ; i!=_files.end() ; i++)
        {
            fn((*i).first);
        }
    }